

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EBFArrayBox.cpp
# Opt level: O2

void __thiscall
amrex::EBFArrayBox::EBFArrayBox
          (EBFArrayBox *this,EBCellFlagFab *ebflag,Box *bx,int ncomps,Arena *ar,
          EBFArrayBoxFactory *factory,int box_index)

{
  int *piVar1;
  undefined8 uVar2;
  int i;
  FabType FVar3;
  long lVar4;
  Box BStack_48;
  
  FArrayBox::FArrayBox(&this->super_FArrayBox,bx,ncomps,ar);
  (this->super_FArrayBox).super_BaseFab<double>._vptr_BaseFab =
       (_func_int **)&PTR__EBFArrayBox_006dad58;
  this->m_ebcellflag = ebflag;
  this->m_factory = factory;
  this->m_box_index = box_index;
  BStack_48.smallend.vect._0_8_ = *(undefined8 *)(bx->smallend).vect;
  uVar2 = *(undefined8 *)((bx->smallend).vect + 2);
  BStack_48.bigend.vect[1] = (int)((ulong)*(undefined8 *)(bx->bigend).vect >> 0x20);
  BStack_48._20_8_ = *(ulong *)((bx->bigend).vect + 2);
  BStack_48.smallend.vect[2] = (int)uVar2;
  BStack_48.bigend.vect[0] = (int)((ulong)uVar2 >> 0x20);
  for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
    if ((BStack_48.btype.itype >> ((uint)lVar4 & 0x1f) & 1) != 0) {
      piVar1 = BStack_48.bigend.vect + lVar4;
      *piVar1 = *piVar1 + -1;
    }
  }
  BStack_48._20_8_ = BStack_48._20_8_ & 0xffffffff;
  FVar3 = EBCellFlagFab::getType(ebflag,&BStack_48);
  *(FabType *)&(this->super_FArrayBox).super_BaseFab<double>.field_0x44 = FVar3;
  return;
}

Assistant:

EBFArrayBox::EBFArrayBox (const EBCellFlagFab& ebflag, const Box& bx, int ncomps, Arena* ar,
                          const EBFArrayBoxFactory* factory, int box_index)
    : FArrayBox(bx, ncomps, ar),
      m_ebcellflag(&ebflag),
      m_factory(factory),
      m_box_index(box_index)
{
    BL_ASSERT(ebflag.box().contains(amrex::enclosedCells(bx)));
    const Box& ccbx = amrex::enclosedCells(bx);
    m_type = ebflag.getType(ccbx);
}